

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O1

void av1_highbd_convolve_2d_scale_c
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int x_step_qn,int subpel_y_qn,int y_step_qn,
               ConvolveParams *conv_params,int bd)

{
  ushort uVar1;
  ushort uVar2;
  int16_t *piVar3;
  uint16_t *puVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  short *psVar17;
  uint16_t *puVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  uint16_t uVar22;
  int iVar23;
  undefined2 *puVar24;
  int iVar25;
  ulong uStack_10c98;
  undefined2 auStack_10c38 [34308];
  
  iVar6 = (h + -1) * y_step_qn + subpel_y_qn >> 10;
  uVar1 = filter_params_y->taps;
  iVar20 = (uVar1 >> 1) - 1;
  uVar13 = (ulong)(uint)w;
  uVar7 = iVar6 + (uint)uVar1;
  bVar10 = (byte)conv_params->round_0;
  if (uVar7 != 0 && SCARRY4(iVar6,(uint)uVar1) == (int)uVar7 < 0) {
    iVar6 = 1 << ((char)bd + 6U & 0x1f);
    uVar2 = filter_params_x->taps;
    lVar16 = (long)src + (2 - ((ulong)(uVar2 & 0xfffffffe) + (long)(iVar20 * src_stride) * 2));
    uStack_10c98 = 0;
    do {
      if (0 < w) {
        piVar3 = filter_params_x->filter_ptr;
        uVar8 = 0;
        uVar21 = subpel_x_qn;
        do {
          iVar14 = iVar6;
          if ((ulong)uVar2 != 0) {
            uVar15 = 0;
            do {
              iVar14 = iVar14 + (uint)*(ushort *)
                                       (lVar16 + (long)((int)uVar21 >> 10) * 2 + uVar15 * 2) *
                                (int)piVar3[(uVar21 >> 6 & 0xf) * (uint)uVar2 + uVar15];
              uVar15 = uVar15 + 1;
            } while (uVar2 != uVar15);
          }
          auStack_10c38[uVar8 + uStack_10c98 * uVar13] =
               (short)(iVar14 + ((1 << (bVar10 & 0x1f)) >> 1) >> (bVar10 & 0x1f));
          uVar8 = uVar8 + 1;
          uVar21 = uVar21 + x_step_qn;
        } while (uVar8 != uVar13);
      }
      uStack_10c98 = uStack_10c98 + 1;
      lVar16 = lVar16 + (long)src_stride * 2;
    } while (uStack_10c98 != uVar7);
  }
  if (0 < w) {
    bVar5 = (byte)conv_params->round_1;
    bVar9 = ('\x0e' - bVar10) - bVar5;
    iVar6 = conv_params->dst_stride;
    puVar4 = conv_params->dst;
    bVar10 = ((char)bd - bVar10) + 0xe;
    iVar25 = 1 << (bVar10 & 0x1f);
    bVar10 = bVar10 - bVar5;
    iVar14 = ((1 << (bVar9 & 0x1f)) >> 1) + (-1 << (bVar10 & 0x1f)) + (-1 << (bVar10 - 1 & 0x1f));
    puVar24 = auStack_10c38 + (1 - (ulong)(uVar1 >> 1)) * uVar13 + (long)(iVar20 * w);
    uVar8 = 0;
    do {
      if (0 < h) {
        piVar3 = filter_params_y->filter_ptr;
        iVar20 = conv_params->is_compound;
        uVar15 = 0;
        uVar7 = subpel_y_qn;
        do {
          uVar1 = filter_params_y->taps;
          iVar23 = iVar25;
          if (uVar1 != 0) {
            psVar17 = puVar24 + ((int)uVar7 >> 10) * w;
            uVar19 = 0;
            do {
              iVar23 = iVar23 + (int)*psVar17 *
                                (int)piVar3[(uVar7 >> 6 & 0xf) * (uint)uVar1 + uVar19];
              uVar19 = uVar19 + 1;
              psVar17 = psVar17 + uVar13;
            } while (uVar1 != uVar19);
          }
          uVar21 = iVar23 + ((1 << (bVar5 & 0x1f)) >> 1) >> (bVar5 & 0x1f);
          uVar22 = (uint16_t)uVar21;
          if (iVar20 == 0) {
            iVar23 = (int)((uVar21 & 0xffff) + iVar14) >> (bVar9 & 0x1f);
            if (bd != 10) goto LAB_0039e8e0;
LAB_0039e8ac:
            iVar12 = 0x3ff;
LAB_0039e8f1:
            if (iVar12 <= iVar23) {
              iVar23 = iVar12;
            }
            if (iVar23 < 1) {
              iVar23 = 0;
            }
            uVar22 = (uint16_t)iVar23;
            puVar18 = dst;
            iVar23 = dst_stride;
          }
          else {
            puVar18 = puVar4;
            iVar23 = iVar6;
            if (conv_params->do_average != 0) {
              uVar11 = (uint)puVar4[uVar8 + uVar15 * (long)iVar6];
              if (conv_params->use_dist_wtd_comp_avg == 0) {
                uVar21 = (uVar21 & 0xffff) + uVar11 >> 1;
              }
              else {
                uVar21 = (int)((uVar21 & 0xffff) * conv_params->bck_offset +
                              uVar11 * conv_params->fwd_offset) >> 4;
              }
              iVar23 = (int)(uVar21 + iVar14) >> (bVar9 & 0x1f);
              if (bd == 10) goto LAB_0039e8ac;
LAB_0039e8e0:
              if (bd == 0xc) {
                iVar12 = 0xfff;
              }
              else {
                iVar12 = 0xff;
              }
              goto LAB_0039e8f1;
            }
          }
          puVar18[(long)iVar23 * uVar15 + uVar8] = uVar22;
          uVar15 = uVar15 + 1;
          uVar7 = uVar7 + y_step_qn;
        } while (uVar15 != (uint)h);
      }
      uVar8 = uVar8 + 1;
      puVar24 = puVar24 + 1;
    } while (uVar8 != uVar13);
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_scale_c(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_x,
                                    const InterpFilterParams *filter_params_y,
                                    const int subpel_x_qn, const int x_step_qn,
                                    const int subpel_y_qn, const int y_step_qn,
                                    ConvolveParams *conv_params, int bd) {
  int16_t im_block[(2 * MAX_SB_SIZE + MAX_FILTER_TAP) * MAX_SB_SIZE];
  int im_h = (((h - 1) * y_step_qn + subpel_y_qn) >> SCALE_SUBPEL_BITS) +
             filter_params_y->taps;
  int im_stride = w;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  CONV_BUF_TYPE *dst16 = conv_params->dst;
  const int dst16_stride = conv_params->dst_stride;
  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  assert(bits >= 0);
  // horizontal filter
  const uint16_t *src_horiz = src - fo_vert * src_stride;
  for (int y = 0; y < im_h; ++y) {
    int x_qn = subpel_x_qn;
    for (int x = 0; x < w; ++x, x_qn += x_step_qn) {
      const uint16_t *const src_x = &src_horiz[(x_qn >> SCALE_SUBPEL_BITS)];
      const int x_filter_idx = (x_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
      assert(x_filter_idx < SUBPEL_SHIFTS);
      const int16_t *x_filter =
          av1_get_interp_filter_subpel_kernel(filter_params_x, x_filter_idx);
      int32_t sum = (1 << (bd + FILTER_BITS - 1));
      for (int k = 0; k < filter_params_x->taps; ++k) {
        sum += x_filter[k] * src_x[k - fo_horiz];
      }
      assert(filter_params_x->taps > 8 ||
             (0 <= sum && sum < (1 << (bd + FILTER_BITS + 1))));
      im_block[y * im_stride + x] =
          (int16_t)ROUND_POWER_OF_TWO(sum, conv_params->round_0);
    }
    src_horiz += src_stride;
  }

  // vertical filter
  int16_t *src_vert = im_block + fo_vert * im_stride;
  const int offset_bits = bd + 2 * FILTER_BITS - conv_params->round_0;
  for (int x = 0; x < w; ++x) {
    int y_qn = subpel_y_qn;
    for (int y = 0; y < h; ++y, y_qn += y_step_qn) {
      const int16_t *src_y = &src_vert[(y_qn >> SCALE_SUBPEL_BITS) * im_stride];
      const int y_filter_idx = (y_qn & SCALE_SUBPEL_MASK) >> SCALE_EXTRA_BITS;
      assert(y_filter_idx < SUBPEL_SHIFTS);
      const int16_t *y_filter =
          av1_get_interp_filter_subpel_kernel(filter_params_y, y_filter_idx);
      int32_t sum = 1 << offset_bits;
      for (int k = 0; k < filter_params_y->taps; ++k) {
        sum += y_filter[k] * src_y[(k - fo_vert) * im_stride];
      }
      assert(filter_params_y->taps > 8 ||
             (0 <= sum && sum < (1 << (offset_bits + 2))));
      CONV_BUF_TYPE res = ROUND_POWER_OF_TWO(sum, conv_params->round_1);
      if (conv_params->is_compound) {
        if (conv_params->do_average) {
          int32_t tmp = dst16[y * dst16_stride + x];
          if (conv_params->use_dist_wtd_comp_avg) {
            tmp = tmp * conv_params->fwd_offset + res * conv_params->bck_offset;
            tmp = tmp >> DIST_PRECISION_BITS;
          } else {
            tmp += res;
            tmp = tmp >> 1;
          }
          /* Subtract round offset and convolve round */
          tmp = tmp - ((1 << (offset_bits - conv_params->round_1)) +
                       (1 << (offset_bits - conv_params->round_1 - 1)));
          dst[y * dst_stride + x] =
              clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, bits), bd);
        } else {
          dst16[y * dst16_stride + x] = res;
        }
      } else {
        /* Subtract round offset and convolve round */
        int32_t tmp = res - ((1 << (offset_bits - conv_params->round_1)) +
                             (1 << (offset_bits - conv_params->round_1 - 1)));
        dst[y * dst_stride + x] =
            clip_pixel_highbd(ROUND_POWER_OF_TWO(tmp, bits), bd);
      }
    }
    src_vert++;
  }
}